

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

ostream * symbols::operator<<(ostream *out,Object *obj)

{
  string local_38 [32];
  Object *local_18;
  Object *obj_local;
  ostream *out_local;
  
  local_18 = obj;
  obj_local = (Object *)out;
  (*obj->_vptr_Object[3])();
  std::operator<<(out,local_38);
  std::__cxx11::string::~string(local_38);
  return (ostream *)obj_local;
}

Assistant:

std::ostream& operator<<(std::ostream &out, Object const *obj)
    {
        out << obj->toString();
        return out;
    }